

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

void gai_scatter_acc_local
               (Integer g_a,void *v,Integer *i,Integer *j,Integer nv,void *alpha,Integer proc)

{
  short sVar1;
  short sVar2;
  int iVar3;
  Integer IVar4;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  ulong in_stack_00000008;
  int optype;
  char err_string_1 [256];
  Integer _index2_1 [7];
  int _i_8;
  int _ndim_8;
  int _ndim_7;
  int _i_7;
  int _itmp_3;
  Integer index_1 [2];
  Integer _index2 [7];
  int _i_6;
  int _ndim_6;
  int _ndim_5;
  int _i_5;
  int _itmp_2;
  Integer index [2];
  char err_string [256];
  int _ndim_4;
  int _i_4;
  int _itmp_1;
  int _offset;
  int _ndim_3;
  int _i_3;
  int _index_3 [7];
  int _ndim_2;
  int _i_2;
  int _itmp;
  int _ndim_1;
  int _i_1;
  int _index_2 [7];
  int _ndim;
  int _i;
  Integer _dimpos_1;
  Integer _dimstart_1;
  Integer _dim_1;
  Integer _index_1;
  Integer _d_1;
  Integer _nb_1;
  Integer _loc_1;
  Integer _dimpos;
  Integer _dimstart;
  Integer _dim;
  Integer _index;
  Integer _d;
  Integer _nb;
  Integer _loc;
  Integer _num_rstrctd;
  Integer _jw;
  Integer _iw;
  Integer _p_handle;
  Integer _hi [2];
  Integer _lo [2];
  Integer g_handle;
  Integer proc_place;
  Integer offset_1;
  Integer _jhi;
  Integer _jlo;
  Integer _ihi;
  Integer _ilo;
  int rc;
  Integer offset;
  Integer k;
  armci_giov_t desc;
  Integer iproc;
  Integer p_handle;
  Integer handle;
  Integer hi [2];
  Integer lo [2];
  Integer type;
  Integer jhi;
  Integer jlo;
  Integer ihi;
  Integer ilo;
  Integer item_size;
  Integer ldp;
  char *ptr_ref;
  void **ptr_dst;
  void **ptr_src;
  long in_stack_fffffffffffffab8;
  armci_giov_t *in_stack_fffffffffffffac0;
  void *in_stack_fffffffffffffac8;
  long in_stack_fffffffffffffad0;
  char local_518 [256];
  ulong auStack_418 [7];
  int local_3dc;
  int local_3d8;
  int local_3d4;
  int local_3d0;
  int local_3cc;
  ulong local_3c8 [4];
  Integer in_stack_fffffffffffffc58;
  char *in_stack_fffffffffffffc60;
  int local_37c;
  int local_370;
  int local_36c;
  long local_368 [2];
  char local_358 [224];
  Integer *in_stack_fffffffffffffd88;
  void *in_stack_fffffffffffffd90;
  Integer in_stack_fffffffffffffd98;
  Integer in_stack_fffffffffffffda0;
  int local_24c;
  int local_248;
  int local_244;
  int local_23c;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  Integer *in_stack_fffffffffffffdd0;
  Integer in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  int local_218;
  int local_214;
  int local_20c;
  int local_208 [10];
  int local_1e0;
  int local_1dc;
  long local_1d8;
  long local_1d0;
  long local_1c8;
  ulong local_1c0;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  long local_1a0;
  long local_198;
  long local_190;
  ulong local_188;
  long local_180;
  long local_178;
  long local_170;
  C_Integer local_168;
  C_Integer local_160;
  C_Integer local_158;
  long local_150;
  armci_giov_t *local_148;
  long local_140;
  long local_138;
  void *local_130;
  long local_128;
  ulong local_120;
  long local_118;
  long local_110;
  void *local_108;
  armci_giov_t *local_100;
  long local_f8;
  int local_ec;
  long local_e8;
  long local_e0;
  void *local_d8;
  void *local_d0;
  undefined4 local_c8;
  undefined4 local_c4;
  ulong local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  void *local_a0;
  long local_98;
  armci_giov_t *local_90;
  long local_88;
  void *local_80;
  armci_giov_t *local_78;
  long local_70;
  long local_68;
  size_t local_60;
  long local_58;
  char *local_50;
  void *local_48;
  void *local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_ec = 0;
  if (0 < in_R8) {
    local_b0 = in_RDI + 1000;
    local_b8 = (long)GA[local_b0].p_handle;
    local_38 = in_R9;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    pnga_distribution(CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                      in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                      (Integer *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    local_68 = local_98;
    local_78 = local_90;
    local_70 = local_a8;
    local_80 = local_a0;
    local_c0 = in_stack_00000008;
    if (GA[local_b0].distr_type == 0) {
      if (0 < GA[local_b0].num_rstrctd) {
        local_c0 = GA[local_b0].rank_rstrctd[in_stack_00000008];
      }
      local_128 = local_10 + 1000;
      local_158 = GA[local_128].width[0];
      local_160 = GA[local_128].width[1];
      local_168 = GA[local_128].num_rstrctd;
      if (GA[local_128].distr_type == 0) {
        if (GA[local_128].num_rstrctd == 0) {
          local_190 = (long)GA[local_128].ndim;
          local_198 = 0;
          local_178 = 1;
          for (local_180 = 0; local_180 < local_190; local_180 = local_180 + 1) {
            local_178 = GA[local_128].nblock[local_180] * local_178;
          }
          if ((local_178 + -1 < (long)local_c0) || ((long)local_c0 < 0)) {
            for (local_180 = 0; local_180 < local_190; local_180 = local_180 + 1) {
              (&local_138)[local_180] = 0;
              (&local_148)[local_180] = (armci_giov_t *)0xffffffffffffffff;
            }
          }
          else {
            local_188 = local_c0;
            for (local_180 = 0; local_180 < local_190; local_180 = local_180 + 1) {
              local_170 = (long)local_188 % (long)GA[local_128].nblock[local_180];
              local_188 = (long)local_188 / (long)GA[local_128].nblock[local_180];
              local_1a0 = local_170 + local_198;
              local_198 = GA[local_128].nblock[local_180] + local_198;
              (&local_138)[local_180] = GA[local_128].mapc[local_1a0];
              if (local_170 == GA[local_128].nblock[local_180] + -1) {
                (&local_148)[local_180] = (armci_giov_t *)GA[local_128].dims[local_180];
              }
              else {
                (&local_148)[local_180] = (armci_giov_t *)(GA[local_128].mapc[local_1a0 + 1] + -1);
              }
            }
          }
        }
        else if ((long)local_c0 < GA[local_128].num_rstrctd) {
          local_1c8 = (long)GA[local_128].ndim;
          local_1d0 = 0;
          local_1b0 = 1;
          for (local_1b8 = 0; local_1b8 < local_1c8; local_1b8 = local_1b8 + 1) {
            local_1b0 = GA[local_128].nblock[local_1b8] * local_1b0;
          }
          if ((local_1b0 + -1 < (long)local_c0) || ((long)local_c0 < 0)) {
            for (local_1b8 = 0; local_1b8 < local_1c8; local_1b8 = local_1b8 + 1) {
              (&local_138)[local_1b8] = 0;
              (&local_148)[local_1b8] = (armci_giov_t *)0xffffffffffffffff;
            }
          }
          else {
            local_1c0 = local_c0;
            for (local_1b8 = 0; local_1b8 < local_1c8; local_1b8 = local_1b8 + 1) {
              local_1a8 = (long)local_1c0 % (long)GA[local_128].nblock[local_1b8];
              local_1c0 = (long)local_1c0 / (long)GA[local_128].nblock[local_1b8];
              local_1d8 = local_1a8 + local_1d0;
              local_1d0 = GA[local_128].nblock[local_1b8] + local_1d0;
              (&local_138)[local_1b8] = GA[local_128].mapc[local_1d8];
              if (local_1a8 == GA[local_128].nblock[local_1b8] + -1) {
                (&local_148)[local_1b8] = (armci_giov_t *)GA[local_128].dims[local_1b8];
              }
              else {
                (&local_148)[local_1b8] = (armci_giov_t *)(GA[local_128].mapc[local_1d8 + 1] + -1);
              }
            }
          }
        }
        else {
          local_1e0 = (int)GA[local_128].ndim;
          for (local_1dc = 0; local_1dc < local_1e0; local_1dc = local_1dc + 1) {
            (&local_138)[local_1dc] = 0;
            (&local_148)[local_1dc] = (armci_giov_t *)0xffffffffffffffff;
          }
        }
      }
      else {
        local_248 = (int)local_c0;
        if (((GA[local_128].distr_type == 1) || (GA[local_128].distr_type == 2)) ||
           (GA[local_128].distr_type == 3)) {
          sVar1 = GA[local_128].ndim;
          sVar2 = GA[local_128].ndim;
          local_208[0] = (int)((long)local_248 % GA[local_128].num_blocks[0]);
          local_214 = local_248;
          for (local_218 = 1; local_218 < sVar2; local_218 = local_218 + 1) {
            local_214 = (int)((long)(local_214 - local_208[local_218 + -1]) /
                             GA[local_128].num_blocks[local_218 + -1]);
            local_208[local_218] = (int)((long)local_214 % GA[local_128].num_blocks[local_218]);
          }
          for (local_20c = 0; local_20c < sVar1; local_20c = local_20c + 1) {
            (&local_138)[local_20c] =
                 (long)local_208[local_20c] * GA[local_128].block_dims[local_20c] + 1;
            (&local_148)[local_20c] =
                 (armci_giov_t *)
                 ((long)(local_208[local_20c] + 1) * GA[local_128].block_dims[local_20c]);
            if (GA[local_128].dims[local_20c] < (long)(&local_148)[local_20c]) {
              (&local_148)[local_20c] = (armci_giov_t *)GA[local_128].dims[local_20c];
            }
          }
        }
        else if (GA[local_128].distr_type == 4) {
          sVar1 = GA[local_128].ndim;
          local_244 = 0;
          sVar2 = GA[local_128].ndim;
          for (local_24c = 1; local_24c < sVar2; local_24c = local_24c + 1) {
            local_248 = (int)((long)(local_248 -
                                    *(int *)(&stack0xfffffffffffffdc8 + (long)(local_24c + -1) * 4))
                             / GA[local_128].num_blocks[local_24c + -1]);
            *(int *)(&stack0xfffffffffffffdc8 + (long)local_24c * 4) =
                 (int)((long)local_248 % GA[local_128].num_blocks[local_24c]);
          }
          for (local_23c = 0; local_23c < sVar1; local_23c = local_23c + 1) {
            (&local_138)[local_23c] =
                 GA[local_128].mapc
                 [local_244 + *(int *)(&stack0xfffffffffffffdc8 + (long)local_23c * 4)];
            if ((long)*(int *)(&stack0xfffffffffffffdc8 + (long)local_23c * 4) <
                GA[local_128].num_blocks[local_23c] + -1) {
              (&local_148)[local_23c] =
                   (armci_giov_t *)
                   (GA[local_128].mapc
                    [local_244 + *(int *)(&stack0xfffffffffffffdc8 + (long)local_23c * 4) + 1] + -1)
              ;
            }
            else {
              (&local_148)[local_23c] = (armci_giov_t *)GA[local_128].dims[local_23c];
            }
            local_244 = local_244 + (int)GA[local_128].num_blocks[local_23c];
          }
        }
      }
      local_150 = (long)GA[local_128].p_handle;
      if (local_150 == 0) {
        local_120 = (ulong)PGRP_LIST->inv_map_proc_list[local_c0];
      }
      else {
        local_120 = local_c0;
        if (local_168 != 0) {
          local_120 = GA[local_128].rstrctd_list[local_c0];
        }
      }
      local_f8 = local_138;
      local_100 = local_148;
      local_108 = local_130;
      local_110 = local_140;
      if ((((local_68 < local_138) || ((long)local_148 < local_68)) ||
          ((long)local_78 < (long)local_130)) || (local_140 < (long)local_78)) {
        sprintf(local_358,"%s:p=%ld invalid i/j (%ld,%ld)><(%ld:%ld,%ld:%ld)","gaShmemLocation",
                local_c0,local_68,local_78);
        pnga_error(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
        in_stack_fffffffffffffab8 = local_138;
        in_stack_fffffffffffffac0 = local_148;
        in_stack_fffffffffffffac8 = local_130;
        in_stack_fffffffffffffad0 = local_140;
      }
      local_118 = (local_68 - local_f8) + local_158 +
                  ((long)local_100 + local_158 * 2 + (1 - local_f8)) *
                  ((long)local_78 + (local_160 - (long)local_108));
      local_50 = GA[local_128].ptr[local_120] +
                 local_118 * ga_types[GA[local_128].type + -1000].size;
      local_58 = (long)local_100 + local_158 * 2 + (1 - local_f8);
    }
    else {
      pnga_access_block_ptr
                (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                 in_stack_fffffffffffffd88);
      pnga_release_block(local_10,local_c0);
      if (GA[local_b0].distr_type == 1) {
        IVar4 = pnga_nnodes();
        in_stack_00000008 = (long)in_stack_00000008 % IVar4;
      }
      else {
        local_36c = (int)in_stack_00000008;
        if (GA[local_b0].distr_type == 2) {
          sVar1 = GA[local_b0].ndim;
          local_368[0] = (long)local_36c % GA[local_b0].num_blocks[0];
          for (local_370 = 1; local_370 < sVar1; local_370 = local_370 + 1) {
            local_36c = (int)(((long)local_36c - local_368[local_370 + -1]) /
                             GA[local_b0].num_blocks[local_370 + -1]);
            local_368[local_370] = (long)local_36c % GA[local_b0].num_blocks[local_370];
          }
          local_368[0] = local_368[0] % (long)GA[local_b0].nblock[0];
          local_368[1] = local_368[1] % (long)GA[local_b0].nblock[1];
          iVar3 = (int)GA[local_b0].ndim;
          for (local_37c = 0; local_37c < iVar3; local_37c = local_37c + 1) {
            local_3c8[(long)local_37c + 2] =
                 local_368[local_37c] % (long)GA[local_b0].nblock[local_37c];
          }
          in_stack_00000008 = local_3c8[(long)(iVar3 + -1) + 2];
          for (local_37c = iVar3 + -2; -1 < local_37c; local_37c = local_37c + -1) {
            in_stack_00000008 =
                 in_stack_00000008 * (long)GA[local_b0].nblock[local_37c] +
                 local_3c8[(long)local_37c + 2];
          }
        }
        else if ((GA[local_b0].distr_type == 3) || (GA[local_b0].distr_type == 4)) {
          sVar1 = GA[local_b0].ndim;
          local_3d4 = (int)sVar1;
          local_3cc = local_36c;
          local_3c8[0] = (long)local_36c % GA[local_b0].num_blocks[0];
          for (local_3d0 = 1; local_3d0 < sVar1; local_3d0 = local_3d0 + 1) {
            local_3cc = (int)((long)((long)local_3cc - local_3c8[local_3d0 + -1]) /
                             GA[local_b0].num_blocks[local_3d0 + -1]);
            local_3c8[local_3d0] = (long)local_3cc % GA[local_b0].num_blocks[local_3d0];
          }
          local_3c8[0] = (long)local_3c8[0] % (long)GA[local_b0].nblock[0];
          local_3c8[1] = (long)local_3c8[1] % (long)GA[local_b0].nblock[1];
          local_3d8 = (int)GA[local_b0].ndim;
          for (local_3dc = 0; local_3dc < local_3d8; local_3dc = local_3dc + 1) {
            auStack_418[local_3dc] =
                 (long)local_3c8[local_3dc] % (long)GA[local_b0].nblock[local_3dc];
          }
          in_stack_00000008 = auStack_418[local_3d8 + -1];
          for (local_3dc = local_3d8 + -2; -1 < local_3dc; local_3dc = local_3dc + -1) {
            in_stack_00000008 =
                 in_stack_00000008 * (long)GA[local_b0].nblock[local_3dc] + auStack_418[local_3dc];
          }
        }
      }
    }
    local_88 = (long)GA[local_b0].type;
    local_60 = ga_types[local_88 + -1000].size;
    local_40 = malloc((long)((int)local_30 << 1) << 3);
    if (local_40 == (void *)0x0) {
      pnga_error(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    }
    local_48 = (void *)((long)local_40 + local_30 * 8);
    for (local_e0 = 0; iVar3 = (int)((ulong)in_stack_fffffffffffffad0 >> 0x20), local_e0 < local_30;
        local_e0 = local_e0 + 1) {
      if (((*(long *)(local_20 + local_e0 * 8) < local_68) ||
          (local_70 < *(long *)(local_20 + local_e0 * 8))) ||
         ((*(long *)(local_28 + local_e0 * 8) < (long)local_78 ||
          ((long)local_80 < *(long *)(local_28 + local_e0 * 8))))) {
        in_stack_fffffffffffffab8 = local_70;
        in_stack_fffffffffffffac0 = local_78;
        in_stack_fffffffffffffac8 = local_80;
        sprintf(local_518,"proc=%d invalid i/j=(%ld,%ld)>< [%ld:%ld,%ld:%ld]",
                in_stack_00000008 & 0xffffffff,*(undefined8 *)(local_20 + local_e0 * 8),
                *(undefined8 *)(local_28 + local_e0 * 8),local_68);
        pnga_error(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      }
      local_e8 = ((*(long *)(local_28 + local_e0 * 8) - (long)local_78) * local_58 +
                 *(long *)(local_20 + local_e0 * 8)) - local_68;
      *(char **)((long)local_48 + local_e0 * 8) = local_50 + local_60 * local_e8;
      *(size_t *)((long)local_40 + local_e0 * 8) = local_18 + local_e0 * local_60;
    }
    local_c4 = (undefined4)local_60;
    local_d8 = local_40;
    local_d0 = local_48;
    local_c8 = (undefined4)local_30;
    if (GA_fence_set != 0) {
      fence_array[in_stack_00000008] = '\x01';
    }
    if (-1 < local_b8) {
      in_stack_00000008 = (ulong)PGRP_LIST[local_b8].inv_map_proc_list[in_stack_00000008];
    }
    if (local_38 != 0) {
      if (((local_88 != 0x3ec) && (local_88 != 0x3ef)) &&
         ((local_88 != 0x3ee &&
          (((local_88 != 0x3e9 && (local_88 != 0x3ea)) && (local_88 != 0x3eb)))))) {
        pnga_error(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      }
      local_ec = ARMCI_AccV(iVar3,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,
                            (int)((ulong)in_stack_fffffffffffffab8 >> 0x20),
                            (int)in_stack_fffffffffffffab8);
    }
    if (local_ec != 0) {
      pnga_error(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    }
    free(local_40);
  }
  return;
}

Assistant:

void gai_scatter_acc_local(Integer g_a, void *v,Integer *i,Integer *j,
                          Integer nv, void* alpha, Integer proc) 
{
void **ptr_src, **ptr_dst;
char *ptr_ref;
Integer ldp, item_size, ilo, ihi, jlo, jhi, type;
Integer lo[2], hi[2];
Integer handle,p_handle,iproc;
armci_giov_t desc;
register Integer k, offset;
int rc=0;

  if (nv < 1) return;

  
  handle = GA_OFFSET + g_a;
  p_handle = GA[handle].p_handle;

  pnga_distribution(g_a, proc, lo, hi);
  ilo = lo[0];
  jlo = lo[1];
  ihi = hi[0];
  jhi = hi[1];

  iproc = proc;
  if (GA[handle].distr_type == REGULAR) {
    if (GA[handle].num_rstrctd > 0)
      iproc = GA[handle].rank_rstrctd[iproc];
    gaShmemLocation(iproc, g_a, ilo, jlo, &ptr_ref, &ldp);
  } else {
    /*
    Integer lo[2];
    lo[0] = ilo;
    lo[1] = jlo;
    */
    pnga_access_block_ptr(g_a, iproc, &ptr_ref, &ldp);
    pnga_release_block(g_a, iproc);
    if (GA[handle].distr_type == BLOCK_CYCLIC) {
      proc = proc%pnga_nnodes();
    } else if (GA[handle].distr_type == SCALAPACK) {
      Integer index[2];
      gam_find_block_indices(handle, proc, index);
      index[0] = index[0]%GA[handle].nblock[0];
      index[1] = index[1]%GA[handle].nblock[1];
      gam_find_proc_from_sl_indices(handle,proc,index);
    } else if (GA[handle].distr_type == TILED ||
        GA[handle].distr_type == TILED_IRREG) {
      Integer index[2];
      gam_find_block_indices(handle, proc, index);
      index[0] = index[0]%GA[handle].nblock[0];
      index[1] = index[1]%GA[handle].nblock[1];
      gam_find_tile_proc_from_indices(handle,proc,index);
    }

  }

  type = GA[handle].type;
  item_size = GAsizeofM(type);

  ptr_src = malloc((int)nv*2*sizeof(void*));
  if(ptr_src==NULL)pnga_error("malloc failed",nv);
  ptr_dst=ptr_src+ nv;

  for(k=0; k< nv; k++){
     if(i[k] < ilo || i[k] > ihi  || j[k] < jlo || j[k] > jhi){
       char err_string[ERR_STR_LEN];
       sprintf(err_string,"proc=%d invalid i/j=(%ld,%ld)>< [%ld:%ld,%ld:%ld]",
               (int)proc, (long)i[k], (long)j[k], (long)ilo, 
               (long)ihi, (long)jlo, (long)jhi); 
       pnga_error(err_string,g_a);
     }

     offset  = (j[k] - jlo)* ldp + i[k] - ilo;
     ptr_dst[k] = ptr_ref + item_size * offset;
     ptr_src[k] = ((char*)v) + k*item_size;
  }
  desc.bytes = (int)item_size;
  desc.src_ptr_array = ptr_src;
  desc.dst_ptr_array = ptr_dst;
  desc.ptr_array_len = (int)nv;

  if(GA_fence_set)fence_array[proc]=1;

  if (p_handle >= 0) {
    proc = PGRP_LIST[p_handle].inv_map_proc_list[proc];
  }
  if(alpha != NULL) {
    int optype=-1;
    if(type==C_DBL) optype= ARMCI_ACC_DBL;
    else if(type==C_DCPL)optype= ARMCI_ACC_DCP;
    else if(type==C_SCPL)optype= ARMCI_ACC_CPL;
    else if(type==C_INT)optype= ARMCI_ACC_INT;
    else if(type==C_LONG)optype= ARMCI_ACC_LNG;
    else if(type==C_FLOAT)optype= ARMCI_ACC_FLT;  
    else pnga_error("type not supported",type);
    rc= ARMCI_AccV(optype, alpha, &desc, 1, (int)proc);
  }

  if(rc) pnga_error("scatter/_acc failed in armci",rc);

  free(ptr_src);

}